

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O0

Operator * __thiscall
adios2::ADIOS::DefineOperator(ADIOS *this,string *name,string *type,Params *parameters)

{
  element_type *type_00;
  string *in_RCX;
  undefined8 in_RDX;
  Operator *in_RDI;
  undefined8 in_R8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *op;
  char *in_stack_ffffffffffffff20;
  Operator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff78;
  ADIOS *in_stack_ffffffffffffff80;
  string local_68 [32];
  string local_48 [32];
  undefined8 local_28;
  
  local_28 = in_R8;
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  CheckPointer(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  type_00 = std::__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<adios2::core::ADIOS,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2861af);
  this_00 = (Operator *)&stack0xffffffffffffff60;
  std::__cxx11::string::string((string *)this_00,in_RCX);
  adios2::core::ADIOS::DefineOperator(type_00,in_RDX,this_00,local_28);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  Operator::Operator(this_00,(string *)type_00,(Params *)0x286215);
  return in_RDI;
}

Assistant:

Operator ADIOS::DefineOperator(const std::string name, const std::string type,
                               const Params &parameters)
{
    CheckPointer("for operator name " + name + ", in call to ADIOS::DefineOperator");
    auto op = &m_ADIOS->DefineOperator(name, type, parameters);
    return Operator(op->first, &op->second);
}